

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<double,true>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  double value;
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Var pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double local_38;
  
  pdVar3 = (double *)this->buffer;
  uVar1 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar2 = this->byteOffset;
  uVar6 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar6 < (ulong)uVar2 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar5) {
LAB_00c04239:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  else {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  lVar11 = 0;
  value = *pdVar3;
LAB_00c04110:
  do {
    local_38 = value;
    lVar10 = lVar11 * 8;
    lVar12 = lVar11;
    do {
      while( true ) {
        lVar10 = lVar10 + 8;
        lVar11 = lVar12 + 1;
        if (lVar11 - (ulong)uVar1 == 1) {
          pvVar9 = JavascriptNumber::ToVarNoCheck(local_38,scriptContext);
          return pvVar9;
        }
        uVar2 = this->byteOffset;
        uVar6 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x71])();
        if ((ulong)uVar6 < (ulong)uVar2 + lVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x9ec,
                                      "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                      ,
                                      "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                     );
          if (!bVar5) goto LAB_00c04239;
          *puVar8 = 0;
        }
        value = pdVar3[lVar12];
        BVar7 = JavascriptNumber::IsNan(value);
        if (BVar7 != 0) {
          return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
        }
        lVar12 = lVar11;
        if (findMax) break;
        if ((value < local_38) ||
           (((value == 0.0 && (!NAN(value))) &&
            (BVar7 = JavascriptNumber::IsNegZero(local_38), BVar7 != 0)))) goto LAB_00c04110;
      }
    } while (value <= local_38);
  } while( true );
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }